

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

bool __thiscall cmCTestCVS::UpdateParser::ProcessLine(UpdateParser *this)

{
  bool bVar1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_30;
  UpdateParser *local_10;
  UpdateParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexFileUpdated,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexFileUpdated,2);
    DoFile(this,PathUpdated,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = cmsys::RegularExpression::find(&this->RegexFileModified,&(this->super_LineParser).Line);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_60,&this->RegexFileModified,2);
      DoFile(this,PathModified,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      bVar1 = cmsys::RegularExpression::find
                        (&this->RegexFileConflicting,&(this->super_LineParser).Line);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_80,&this->RegexFileConflicting,2);
        DoFile(this,PathConflicting,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
      else {
        bVar1 = cmsys::RegularExpression::find
                          (&this->RegexFileRemoved1,&(this->super_LineParser).Line);
        if (bVar1) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_a0,&this->RegexFileRemoved1,1);
          DoFile(this,PathUpdated,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
        }
        else {
          bVar1 = cmsys::RegularExpression::find
                            (&this->RegexFileRemoved2,&(this->super_LineParser).Line);
          if (bVar1) {
            cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&this->RegexFileRemoved2,1);
            DoFile(this,PathUpdated,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
      }
    }
  }
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->RegexFileUpdated.find(this->Line))
      {
      this->DoFile(PathUpdated, this->RegexFileUpdated.match(2));
      }
    else if(this->RegexFileModified.find(this->Line))
      {
      this->DoFile(PathModified, this->RegexFileModified.match(2));
      }
    else if(this->RegexFileConflicting.find(this->Line))
      {
      this->DoFile(PathConflicting, this->RegexFileConflicting.match(2));
      }
    else if(this->RegexFileRemoved1.find(this->Line))
      {
      this->DoFile(PathUpdated, this->RegexFileRemoved1.match(1));
      }
    else if(this->RegexFileRemoved2.find(this->Line))
      {
      this->DoFile(PathUpdated, this->RegexFileRemoved2.match(1));
      }
    return true;
    }